

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::IsValid(ON_NurbsCage *this,ON_TextLog *param_1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_EAX;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)((int)((ulong)this->m_cv >> 0x20) == 0 && (int)this->m_cv == 0);
  auVar8._4_4_ = -(uint)((int)this->m_knot[0] == 0 && (int)((ulong)this->m_knot[0] >> 0x20) == 0);
  auVar8._8_4_ = -(uint)(*(int *)((long)this->m_knot + 0xc) == 0 && *(int *)(this->m_knot + 1) == 0)
  ;
  auVar8._12_4_ =
       -(uint)(*(int *)(this->m_knot + 2) == 0 && *(int *)((long)this->m_knot + 0x14) == 0);
  iVar4 = movmskps(in_EAX,auVar8);
  if (((((iVar4 == 0) && (1 < this->m_order[0])) && (1 < this->m_order[1])) &&
      ((1 < this->m_order[2] && (this->m_order[0] <= this->m_cv_count[0])))) &&
     ((this->m_order[1] <= this->m_cv_count[1] &&
      ((this->m_order[2] <= this->m_cv_count[2] && (0 < this->m_dim)))))) {
    iVar4 = this->m_dim + (uint)this->m_is_rat;
    if ((this->m_cv_capacity < 1) ||
       ((uint)(this->m_cv_count[2] * iVar4 * this->m_cv_count[1] * this->m_cv_count[0]) <=
        (uint)this->m_cv_capacity)) {
      iVar1 = this->m_cv_stride[2];
      uVar2 = (uint)(this->m_cv_stride[0] <= this->m_cv_stride[1]);
      uVar7 = (ulong)uVar2;
      uVar3 = (uint)(this->m_cv_stride[1] < this->m_cv_stride[0]);
      uVar5 = (ulong)uVar3;
      if (iVar1 < this->m_cv_stride[uVar5]) {
        uVar6 = (ulong)uVar3;
        uVar5 = 2;
      }
      else {
        uVar6 = (ulong)uVar2;
        if (iVar1 < this->m_cv_stride[uVar2]) {
          uVar6 = 2;
        }
        uVar7 = 2;
        if (iVar1 < this->m_cv_stride[uVar2]) {
          uVar7 = (ulong)uVar2;
        }
      }
      if ((iVar4 <= this->m_cv_stride[uVar5]) &&
         (this->m_cv_stride[uVar5] * this->m_cv_count[uVar5] <= this->m_cv_stride[uVar6])) {
        return this->m_cv_stride[uVar6] * this->m_cv_count[uVar6] <= this->m_cv_stride[uVar7];
      }
    }
  }
  return false;
}

Assistant:

bool ON_NurbsCage::IsValid( 
  ON_TextLog* //text_log 
) const
{
  if ( 0 == m_cv )
    return false;

  if ( 0 == m_knot[0] )
    return false;

  if ( 0 == m_knot[1] )
    return false;

  if ( 0 == m_knot[2] )
    return false;

  if ( m_order[0] < 2 )
    return false;
  if ( m_order[1] < 2 )
    return false;
  if ( m_order[2] < 2 )
    return false;

  if ( m_cv_count[0] < m_order[0] )
    return false;
  if ( m_cv_count[1] < m_order[1] )
    return false;
  if ( m_cv_count[2] < m_order[2] )
    return false;

  if ( m_dim <= 0 )
    return false;
  if ( m_is_rat != 0 && m_is_rat != 1 )
    return false;

  const int cvdim = m_is_rat ? (m_dim+1) : m_dim;

  if ( m_cv_capacity > 0 && m_cv_capacity < cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2] )
    return false;

  int i[3];
  i[0] = (m_cv_stride[0] <= m_cv_stride[1]) ? 0 : 1;
  i[1] = 1-i[0];
  if ( m_cv_stride[2] < m_cv_stride[i[0]] )
  {
    i[2] = i[1];
    i[1] = i[0];
    i[0] = 2;
  }
  else if ( m_cv_stride[2] < m_cv_stride[i[1]] )
  {
    i[2] = i[1];
    i[1] = 2;
  }
  else
  {
    i[2] = 2;
  }

  if ( m_cv_stride[i[0]] < cvdim )
    return false;
  if ( m_cv_stride[i[1]] < m_cv_stride[i[0]]*m_cv_count[i[0]] )
    return false;
  if ( m_cv_stride[i[2]] < m_cv_stride[i[1]]*m_cv_count[i[1]] )
    return false;

  return true;
}